

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_statemachine(Curl_easy *data,connectdata *conn)

{
  ulong uVar1;
  ushort *puVar2;
  byte bVar3;
  SMTP *pSVar4;
  ulong uVar5;
  curl_slist *pcVar6;
  uint uVar7;
  _Bool _Var8;
  unsigned_short uVar9;
  CURLcode CVar10;
  smtpstate sVar11;
  smtp_conn *smtpc;
  pingpong *pp;
  size_t sVar12;
  size_t maxlen;
  char *pcVar13;
  byte *pbVar14;
  size_t sVar15;
  bool bVar16;
  int smtpcode;
  size_t nread;
  uint local_54;
  pingpong *local_50;
  saslprogress local_48;
  undefined4 uStack_44;
  dynbuf *local_40;
  size_t local_38;
  
  local_38 = 0;
  if ((conn->proto).smtpc.state == SMTP_UPGRADETLS) {
LAB_0015534c:
    CVar10 = smtp_perform_upgrade_tls(data);
  }
  else {
    pp = (pingpong *)&conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar10 = Curl_pp_flushsend(data,pp);
      return CVar10;
    }
    local_40 = &(conn->proto).ftpc.pp.recvbuf;
    do {
      CVar10 = Curl_pp_readresp(data,0,pp,(int *)&local_54,&local_38);
      uVar7 = local_54;
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      sVar11 = (conn->proto).smtpc.state;
      if (local_54 != 1 && sVar11 != SMTP_QUIT) {
        (data->info).httpcode = local_54;
      }
      if (local_54 == 0) {
        return CURLE_OK;
      }
      switch(sVar11) {
      case SMTP_SERVERGREET:
        if (99 < local_54 - 200) {
          pcVar13 = "Got unexpected smtp-server response: %d";
          goto LAB_00155994;
        }
        CVar10 = smtp_perform_ehlo(data);
        break;
      case SMTP_EHLO:
        bVar16 = local_54 == 1;
        local_50 = pp;
        pcVar13 = Curl_dyn_ptr(local_40);
        pp = local_50;
        if (0xffffff9b < uVar7 - 300 || bVar16) {
          uVar5 = (conn->proto).ftpc.pp.nfinal;
          if (uVar5 < 4) {
            Curl_failf(data,"Unexpectedly short EHLO response");
            return CURLE_WEIRD_SERVER_REPLY;
          }
          uVar1 = uVar5 - 4;
          if (uVar1 < 8) {
            if (3 < uVar1) {
              if (*(int *)(pcVar13 + 4) == 0x455a4953) goto LAB_001558df;
              if (uVar1 != 4) goto LAB_0015580e;
            }
          }
          else if (*(long *)(pcVar13 + 4) == 0x534c545452415453) {
            pbVar14 = (byte *)((long)&conn->proto + 0xd0);
            *pbVar14 = *pbVar14 | 2;
          }
          else if (*(int *)(pcVar13 + 4) == 0x455a4953) {
LAB_001558df:
            pbVar14 = (byte *)((long)&conn->proto + 0xd0);
            *pbVar14 = *pbVar14 | 4;
          }
          else if (*(long *)(pcVar13 + 4) == 0x3846545550544d53) {
            pbVar14 = (byte *)((long)&conn->proto + 0xd0);
            *pbVar14 = *pbVar14 | 8;
          }
          else {
LAB_0015580e:
            if (pcVar13[8] == ' ' && *(int *)(pcVar13 + 4) == 0x48545541) {
              pbVar14 = (byte *)((long)&conn->proto + 0xd0);
              *pbVar14 = *pbVar14 | 0x10;
              sVar15 = uVar5 - 9;
              if (sVar15 != 0) {
                pbVar14 = (byte *)(pcVar13 + 9);
                do {
                  while (((ulong)*pbVar14 < 0x21 &&
                         ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0))) {
                    pbVar14 = pbVar14 + 1;
                    sVar15 = sVar15 - 1;
                    if (sVar15 == 0) goto LAB_001558f1;
                  }
                  sVar12 = 0;
                  do {
                    if (((ulong)pbVar14[sVar12] < 0x21) &&
                       (maxlen = sVar12, (0x100002600U >> ((ulong)pbVar14[sVar12] & 0x3f) & 1) != 0)
                       ) break;
                    sVar12 = sVar12 + 1;
                    maxlen = sVar15;
                  } while (sVar15 != sVar12);
                  uVar9 = Curl_sasl_decode_mech((char *)pbVar14,maxlen,(size_t *)&local_48);
                  if ((uVar9 != 0) && (CONCAT44(uStack_44,local_48) == maxlen)) {
                    puVar2 = (ushort *)((long)&conn->proto + 0xb8);
                    *puVar2 = *puVar2 | uVar9;
                  }
                  pbVar14 = pbVar14 + maxlen;
                  sVar15 = sVar15 - maxlen;
                  pp = local_50;
                } while (sVar15 != 0);
              }
            }
          }
LAB_001558f1:
          if (uVar7 != 1) {
            if (((data->set).use_ssl != '\0') && (_Var8 = Curl_conn_is_ssl(conn,0), !_Var8)) {
              if ((*(byte *)((long)&conn->proto + 0xd0) & 2) != 0) {
                CVar10 = smtp_perform_starttls(data,conn);
                break;
              }
              if ((data->set).use_ssl != '\x01') {
                Curl_failf(data,"STARTTLS not supported.");
                return CURLE_USE_SSL_FAILED;
              }
            }
            CVar10 = smtp_perform_authentication(data);
            break;
          }
          goto LAB_001557c2;
        }
        if ((1 < (data->set).use_ssl) && (_Var8 = Curl_conn_is_ssl(conn,0), !_Var8))
        goto LAB_00155953;
        *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
        CVar10 = Curl_pp_sendf(data,pp,"HELO %s",(conn->proto).ftpc.newhost);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        sVar11 = SMTP_HELO;
        goto LAB_00155634;
      case SMTP_HELO:
        if (99 < local_54 - 200) {
LAB_00155953:
          Curl_failf(data,"Remote access denied: %d",(ulong)uVar7);
          return CURLE_REMOTE_ACCESS_DENIED;
        }
        goto switchD_00155409_caseD_5;
      case SMTP_STARTTLS:
        if ((data->conn->proto).ftpc.pp.overflow != 0) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (local_54 == 0xdc) {
          CVar10 = smtp_perform_upgrade_tls(data);
        }
        else {
          if ((data->set).use_ssl != '\x01') {
            Curl_failf(data,"STARTTLS denied, code %d",(ulong)local_54);
            return CURLE_USE_SSL_FAILED;
          }
          CVar10 = smtp_perform_authentication(data);
        }
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        sVar11 = (conn->proto).smtpc.state;
        if (sVar11 != SMTP_UPGRADETLS) goto LAB_001557c9;
        goto LAB_0015534c;
      default:
        goto switchD_00155409_caseD_5;
      case SMTP_AUTH:
        CVar10 = Curl_sasl_continue(&(data->conn->proto).imapc.sasl,data,local_54,&local_48);
        if (CVar10 == CURLE_OK) {
          if (local_48 == SASL_IDLE) {
            Curl_failf(data,"Authentication cancelled");
            CVar10 = CURLE_LOGIN_DENIED;
          }
          else {
            CVar10 = CURLE_OK;
            if (local_48 == SASL_DONE) {
              CVar10 = CURLE_OK;
              smtp_state(data,SMTP_STOP);
            }
          }
        }
        break;
      case SMTP_COMMAND:
        pSVar4 = (data->req).p.smtp;
        pcVar13 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
        if (uVar7 - 300 < 0xffffff9c && pSVar4->rcpt != (curl_slist *)0x0) {
          if ((uVar7 == 1) || (uVar7 == 0x229)) {
LAB_00155652:
            CVar10 = CURLE_OK;
            if (((data->req).field_0xdb & 2) == 0) {
              CVar10 = Curl_client_write(data,1,pcVar13,(data->conn->proto).ftpc.pp.nfinal);
            }
            if (uVar7 != 1) {
              if ((pSVar4->rcpt == (curl_slist *)0x0) ||
                 (pcVar6 = pSVar4->rcpt->next, pSVar4->rcpt = pcVar6, pcVar6 == (curl_slist *)0x0))
              {
                smtp_state(data,SMTP_STOP);
              }
              else {
                CVar10 = smtp_perform_command(data);
              }
            }
            break;
          }
        }
        else if (((0xffffff9b < uVar7 - 300) || (uVar7 == 1)) || (pSVar4->rcpt != (curl_slist *)0x0)
                ) goto LAB_00155652;
        pcVar13 = "Command failed: %d";
LAB_00155994:
        Curl_failf(data,pcVar13,(ulong)uVar7);
        return CURLE_WEIRD_SERVER_REPLY;
      case SMTP_MAIL:
        if (99 < local_54 - 200) {
          pcVar13 = "MAIL failed: %d";
LAB_001559cc:
          Curl_failf(data,pcVar13,(ulong)local_54);
          return CURLE_SEND_ERROR;
        }
        goto LAB_00155732;
      case SMTP_RCPT:
        pSVar4 = (data->req).p.smtp;
        if (local_54 - 200 < 100) {
          pSVar4->field_0x28 = pSVar4->field_0x28 | 1;
        }
        else {
          bVar3 = (data->set).field_0x8c0;
          pSVar4->rcpt_last_error = local_54;
          if ((bVar3 & 1) == 0) {
            pcVar13 = "RCPT failed: %d";
            goto LAB_001559cc;
          }
        }
        pcVar6 = pSVar4->rcpt->next;
        pSVar4->rcpt = pcVar6;
        if (pcVar6 == (curl_slist *)0x0) {
          if ((pSVar4->field_0x28 & 1) == 0) {
            local_54 = pSVar4->rcpt_last_error;
            pcVar13 = "RCPT failed: %d (last error)";
            goto LAB_001559cc;
          }
          CVar10 = Curl_pp_sendf(data,pp,"%s","DATA");
          if (CVar10 != CURLE_OK) {
            return CVar10;
          }
          sVar11 = SMTP_DATA;
          goto LAB_00155634;
        }
LAB_00155732:
        CVar10 = smtp_perform_rcpt_to(data);
        break;
      case SMTP_DATA:
        if (local_54 != 0x162) {
          pcVar13 = "DATA failed: %d";
          goto LAB_001559cc;
        }
        Curl_pgrsSetUploadSize(data,(data->state).infilesize);
        Curl_xfer_setup1(data,2,-1,false);
        goto switchD_00155409_caseD_5;
      case SMTP_POSTDATA:
        smtp_state(data,SMTP_STOP);
        if (uVar7 != 0xfa) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        goto LAB_001557c2;
      }
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
LAB_001557c2:
      sVar11 = (conn->proto).smtpc.state;
LAB_001557c9:
      if (sVar11 == SMTP_STOP) {
        return CURLE_OK;
      }
      _Var8 = Curl_pp_moredata(pp);
      CVar10 = CURLE_OK;
    } while (_Var8);
  }
  return CVar10;
switchD_00155409_caseD_5:
  sVar11 = SMTP_STOP;
LAB_00155634:
  smtp_state(data,sVar11);
  goto LAB_001557c2;
}

Assistant:

static CURLcode smtp_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
upgrade_tls:
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(data);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(data, smtpcode, smtpc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (smtpc->state == SMTP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
    default:
      /* internal error */
      smtp_state(data, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}